

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O0

void __thiscall
rpn::RPNExpression::Push<rpn::StringExpression,char_const(&)[1]>
          (RPNExpression *this,char (*args) [1])

{
  unique_ptr<rpn::StringExpression,_std::default_delete<rpn::StringExpression>_> local_28;
  unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> local_20;
  char (*local_18) [1];
  char (*args_local) [1];
  RPNExpression *this_local;
  
  local_18 = args;
  args_local = (char (*) [1])this;
  std::make_unique<rpn::StringExpression,char_const(&)[1]>((char (*) [1])&local_28);
  std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>::
  unique_ptr<rpn::StringExpression,std::default_delete<rpn::StringExpression>,void>
            ((unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>> *)&local_20,
             &local_28);
  Push(this,(expression_ptr *)&local_20);
  std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>::~unique_ptr(&local_20);
  std::unique_ptr<rpn::StringExpression,_std::default_delete<rpn::StringExpression>_>::~unique_ptr
            (&local_28);
  return;
}

Assistant:

void Push(ExprArgs&&... args)
    {
        Push(std::make_unique<ExprT>(std::forward<ExprArgs>(args)...));
    }